

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O2

Curl_handler * Curl_builtin_scheme(char *scheme)

{
  Curl_handler *pCVar1;
  int iVar2;
  Curl_handler **ppCVar3;
  
  ppCVar3 = protocols;
  do {
    pCVar1 = *ppCVar3;
    if (pCVar1 == (Curl_handler *)0x0) {
      return (Curl_handler *)0x0;
    }
    iVar2 = Curl_strcasecompare(pCVar1->scheme,scheme);
    ppCVar3 = ppCVar3 + 1;
  } while (iVar2 == 0);
  return pCVar1;
}

Assistant:

const struct Curl_handler *Curl_builtin_scheme(const char *scheme)
{
  const struct Curl_handler * const *pp;
  const struct Curl_handler *p;
  /* Scan protocol handler table and match against 'scheme'. The handler may
     be changed later when the protocol specific setup function is called. */
  for(pp = protocols; (p = *pp) != NULL; pp++)
    if(strcasecompare(p->scheme, scheme))
      /* Protocol found in table. Check if allowed */
      return p;
  return NULL; /* not found */
}